

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O1

errr Term_addch(wchar_t a,wchar_t c)

{
  int iVar1;
  term_win *ptVar2;
  int iVar3;
  errr eVar4;
  
  ptVar2 = Term->scr;
  eVar4 = -1;
  if (ptVar2->cu == false) {
    if (c == L'\0') {
      eVar4 = -2;
    }
    else {
      iVar1 = Term->wid;
      eVar4 = 0;
      Term_queue_char(Term,ptVar2->cx,ptVar2->cy,a,c,L'\0',L'\0');
      ptVar2 = Term->scr;
      iVar3 = ptVar2->cx + 1;
      ptVar2->cx = iVar3;
      if (iVar1 <= iVar3) {
        ptVar2->cu = true;
        eVar4 = 1;
      }
    }
  }
  return eVar4;
}

Assistant:

errr Term_addch(int a, wchar_t c)
{
	int w = Term->wid;

	/* Handle "unusable" cursor */
	if (Term->scr->cu) return (-1);

	/* Paranoia -- no illegal chars */
	if (!c) return (-2);

	/* Queue the given character for display */
	Term_queue_char(Term, Term->scr->cx, Term->scr->cy, a, c, 0, 0);

	/* Advance the cursor */
	Term->scr->cx++;

	/* Success */
	if (Term->scr->cx < w) return (0);

	/* Note "Useless" cursor */
	Term->scr->cu = 1;

	/* Note "Useless" cursor */
	return (1);
}